

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_AddNodes_single
               (UA_Server *server,UA_Session *session,UA_AddNodesItem *item,
               UA_AddNodesResult *result,UA_InstantiationCallback *instantiationCallback)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  UA_NodeClass UVar11;
  UA_VariableAttributes *attr;
  UA_SecureChannel *pUVar12;
  undefined1 uVar13;
  UA_StatusCode UVar14;
  uint uVar15;
  UA_StatusCode UVar16;
  UA_NodeStoreEntry *pUVar17;
  UA_DataType *pUVar18;
  long lVar19;
  ulong uVar20;
  UA_Logger logger;
  ulong uVar21;
  UA_Node *node;
  long lVar22;
  undefined8 uVar23;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  UVar16 = 0x80620000;
  if (((item->nodeAttributes).encoding < UA_EXTENSIONOBJECT_DECODED) ||
     ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x0)) {
    node = (UA_Node *)0x0;
    goto LAB_00121ae5;
  }
  pUVar17 = instantiateEntry(item->nodeClass);
  node = &pUVar17->node;
  if (pUVar17 == (UA_NodeStoreEntry *)0x0) {
    node = (UA_Node *)0x0;
    UVar16 = 0x80030000;
    goto LAB_00121ae5;
  }
  attr = (UA_VariableAttributes *)(item->nodeAttributes).content.decoded.data;
  UVar14 = copyStandardAttributes(node,item,(UA_NodeAttributes *)attr);
  UVar11 = item->nodeClass;
  UVar16 = 0x805f0000;
  if ((int)UVar11 < 0x10) {
    if (UVar11 == UA_NODECLASS_OBJECT) {
      pUVar18 = (UA_DataType *)0x1407c0;
LAB_00121a3c:
      UVar16 = 0x80620000;
      if ((item->nodeAttributes).content.decoded.type == pUVar18) {
        uVar13 = *(undefined1 *)&(attr->value).type;
        goto LAB_00121a50;
      }
    }
    else if (UVar11 == UA_NODECLASS_VARIABLE) {
      UVar16 = 0x80620000;
      if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13f9e0) {
        pUVar17[2].node.nodeId.identifier.guid.data4[0] = attr->accessLevel;
        pUVar17[2].node.nodeId.identifier.guid.data4[1] = attr->userAccessLevel;
        *(UA_Boolean *)&pUVar17[2].node.browseName.namespaceIndex = attr->historizing;
        *(UA_Double *)&pUVar17[2].node.nodeClass = attr->minimumSamplingInterval;
        goto LAB_00121ab3;
      }
    }
    else if (UVar11 == UA_NODECLASS_OBJECTTYPE) {
      pUVar18 = (UA_DataType *)0x13fec0;
      goto LAB_00121a3c;
    }
  }
  else if ((int)UVar11 < 0x40) {
    if (UVar11 == UA_NODECLASS_VARIABLETYPE) {
      UVar16 = 0x80620000;
      if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x140550) {
        pUVar17[2].node.nodeId.identifier.guid.data4[0] = attr->accessLevel;
LAB_00121ab3:
        uVar15 = copyCommonVariableAttributes(server,(UA_VariableNode *)node,item,attr);
        goto LAB_00121ac6;
      }
    }
    else if ((UVar11 == UA_NODECLASS_REFERENCETYPE) &&
            (UVar16 = 0x80620000,
            (item->nodeAttributes).content.decoded.type == (UA_DataType *)0x140700)) {
      *(undefined1 *)&pUVar17[1].orig = *(undefined1 *)&(attr->value).type;
      *(undefined1 *)((long)&pUVar17[1].orig + 1) = *(undefined1 *)((long)&(attr->value).type + 1);
      uVar15 = UA_copy(&(attr->value).storageType,&pUVar17[1].node,UA_TYPES + 0x14);
LAB_00121ac6:
      UVar16 = uVar15 | UVar14;
    }
  }
  else {
    if (UVar11 == UA_NODECLASS_DATATYPE) {
      pUVar18 = (UA_DataType *)0x1400d0;
      goto LAB_00121a3c;
    }
    if ((UVar11 != UA_NODECLASS_VIEW) ||
       (UVar16 = 0x80620000, (item->nodeAttributes).content.decoded.type != (UA_DataType *)0x13f8c0)
       ) goto LAB_00121acd;
    *(undefined1 *)((long)&pUVar17[1].orig + 1) = *(undefined1 *)&(attr->value).type;
    uVar13 = *(undefined1 *)((long)&(attr->value).type + 1);
LAB_00121a50:
    *(undefined1 *)&pUVar17[1].orig = uVar13;
    UVar16 = UVar14;
  }
LAB_00121acd:
  if (UVar16 != 0) {
    UA_NodeStore_deleteNode(node);
    node = (UA_Node *)0x0;
  }
LAB_00121ae5:
  result->statusCode = UVar16;
  if (UVar16 == 0) {
    if (node == (UA_Node *)0x0) {
      __assert_fail("node != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x55d2,
                    "void Service_AddNodes_single(UA_Server *, UA_Session *, const UA_AddNodesItem *, UA_AddNodesResult *, UA_InstantiationCallback *)"
                   );
    }
    UVar16 = Service_AddNodes_existing
                       (server,session,node,(UA_NodeId *)item,&item->referenceTypeId,
                        &(item->typeDefinition).nodeId,instantiationCallback,&result->addedNodeId);
    result->statusCode = UVar16;
    if (UVar16 == 0) {
      return;
    }
    pUVar12 = session->channel;
    uVar21 = 0;
    uVar20 = 0;
    if ((pUVar12 != (UA_SecureChannel *)0x0) && (pUVar12->connection != (UA_Connection *)0x0)) {
      uVar20 = (ulong)(uint)pUVar12->connection->sockfd;
    }
    if (pUVar12 != (UA_SecureChannel *)0x0) {
      uVar21 = (ulong)(pUVar12->securityToken).channelId;
    }
    logger = (server->config).logger;
    uVar15 = (session->sessionId).identifier.numeric;
    uVar9 = (session->sessionId).identifier.guid.data2;
    uVar10 = (session->sessionId).identifier.guid.data3;
    bVar1 = (session->sessionId).identifier.guid.data4[0];
    bVar2 = (session->sessionId).identifier.guid.data4[1];
    bVar3 = (session->sessionId).identifier.guid.data4[2];
    bVar4 = (session->sessionId).identifier.guid.data4[3];
    bVar5 = (session->sessionId).identifier.guid.data4[4];
    bVar6 = (session->sessionId).identifier.guid.data4[5];
    bVar7 = (session->sessionId).identifier.guid.data4[6];
    bVar8 = (session->sessionId).identifier.guid.data4[7];
    lVar19 = 0;
    lVar22 = 0x142ba0;
    do {
      if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar19) == UVar16) {
        lVar22 = (long)&statusCodeDescriptions[0].code + lVar19;
        break;
      }
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x1578);
    uVar23 = *(undefined8 *)(lVar22 + 8);
  }
  else {
    pUVar12 = session->channel;
    uVar21 = 0;
    uVar20 = 0;
    if ((pUVar12 != (UA_SecureChannel *)0x0) && (pUVar12->connection != (UA_Connection *)0x0)) {
      uVar20 = (ulong)(uint)pUVar12->connection->sockfd;
    }
    if (pUVar12 != (UA_SecureChannel *)0x0) {
      uVar21 = (ulong)(pUVar12->securityToken).channelId;
    }
    logger = (server->config).logger;
    uVar15 = (session->sessionId).identifier.numeric;
    uVar9 = (session->sessionId).identifier.guid.data2;
    uVar10 = (session->sessionId).identifier.guid.data3;
    bVar1 = (session->sessionId).identifier.guid.data4[0];
    bVar2 = (session->sessionId).identifier.guid.data4[1];
    bVar3 = (session->sessionId).identifier.guid.data4[2];
    bVar4 = (session->sessionId).identifier.guid.data4[3];
    bVar5 = (session->sessionId).identifier.guid.data4[4];
    bVar6 = (session->sessionId).identifier.guid.data4[5];
    bVar7 = (session->sessionId).identifier.guid.data4[6];
    bVar8 = (session->sessionId).identifier.guid.data4[7];
    lVar19 = 0;
    lVar22 = 0x142ba0;
    do {
      if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar19) == UVar16) {
        lVar22 = (long)&statusCodeDescriptions[0].code + lVar19;
        break;
      }
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x1578);
    uVar23 = *(undefined8 *)(lVar22 + 8);
  }
  local_38 = (ulong)bVar1;
  local_40 = (ulong)bVar2;
  local_48 = (ulong)uVar9;
  local_50 = (ulong)uVar10;
  UA_LOG_INFO(logger,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Could not add node with error code %s"
              ,uVar20,uVar21,(ulong)uVar15,local_48,local_50,local_38,local_40,(ulong)bVar3,
              (ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8,uVar23);
  return;
}

Assistant:

static void
Service_AddNodes_single(UA_Server *server, UA_Session *session,
                        const UA_AddNodesItem *item, UA_AddNodesResult *result,
                        UA_InstantiationCallback *instantiationCallback) {
    /* Create the node from the attributes*/
    UA_Node *node = NULL;
    result->statusCode = createNodeFromAttributes(server, item, &node);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
        return;
    }

    /* Run consistency checks and add the node */
    UA_assert(node != NULL);
    result->statusCode = Service_AddNodes_existing(server, session, node, &item->parentNodeId.nodeId,
                                                   &item->referenceTypeId, &item->typeDefinition.nodeId,
                                                   instantiationCallback, &result->addedNodeId);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
    }
}